

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::SideConnectLocId
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int node,int side)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  
  iVar1 = pztopology::TPZQuadrilateral::NumSides(0x1a06709);
  return (in_ESI + in_EDX) - (8 - iVar1);
}

Assistant:

int TPZCompElHDiv<TSHAPE>::SideConnectLocId(int node,int side) const {
#ifdef PZDEBUG
	if(TSHAPE::SideDimension(side)<= TSHAPE::Dimension - 2 || node >= NSideConnects(side)) {
		PZError << "TPZCompElHDiv<TSHAPE>::SideConnectLocId no connect associate " <<  endl;
		return -1;
	}
#endif

    return node+side-(TSHAPE::NSides-TSHAPE::NumSides(TSHAPE::Dimension-1)-1);
}